

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-terrain.cpp
# Opt level: O1

bool loadDmapTexture(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_texture *texture;
  
  if (g_terrain.dmap.pathToFile._M_string_length != 0) {
    texture = (djg_texture *)malloc(0x20);
    texture->next = (djg_texture *)0x0;
    texture->texels = (char *)0x0;
    texture->x = 0;
    texture->y = 0;
    texture->comp = 1;
    texture->pf = 0;
    fwrite("Loading {Dmap-Texture}\n",0x17,1,_stdout);
    fflush(_stdout);
    djgt_push_image_u16(texture,g_terrain.dmap.pathToFile._M_dataplus._M_p,true);
    loadSmapTexture(texture);
    (*glad_glActiveTexture)(0x84c3);
    bVar1 = djgt_to_gl(texture,0xde1,0x822a,true,true,g_gl.textures + 3);
    if (bVar1) {
      (*glad_glTexParameteri)(0xde1,0x2801,0x2703);
      (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
      (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
      (*glad_glActiveTexture)(0x84c0);
    }
    else {
      fwrite("=> Failure <=\n",0xe,1,_stdout);
      fflush(_stdout);
    }
    djgt_release(texture);
    if (!bVar1) {
      return false;
    }
  }
  GVar2 = (*glad_glGetError)();
  return GVar2 == 0;
}

Assistant:

dja::mat3 keyToXform(uint32_t key)
{
    dja::mat3 xf = dja::mat3(1.f);

    while (key > 1u) {
        xf = bitToXform(key & 1u) * xf;
        key = key >> 1u;
    }

    return xf;
}